

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_constructor_test.h
# Opt level: O1

void phmap::priv::
     BucketCountAllocTest<phmap::flat_hash_map<phmap::priv::hash_internal::EnumClass,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>>
               (void)

{
  char *pcVar1;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  A alloc;
  flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  m;
  AssertHelper local_a0;
  Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  AssertHelper local_68;
  Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_> local_60;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  local_58;
  
  local_60.id_ = 0;
  local_58.size_ = 0;
  local_58.capacity_ = 0;
  local_58.ctrl_ = (ctrl_t *)0x0;
  local_58.slots_ = (slot_type *)0x0;
  local_58.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  .
  super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  .
  super__Tuple_impl<3UL,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  .
  super__Head_base<3UL,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_false>
  ._M_head_impl.id_ =
       (_Head_base<3UL,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_false>
        )(Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>)0x0;
  local_58.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  .
  super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  .super__Head_base<2UL,_phmap::priv::StatefulTestingEqual,_false>._M_head_impl.
  super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (StatefulTestingEqual)
       (StatefulTestingEqual)
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId.
       super_WithId<phmap::priv::StatefulTestingEqual>.id_;
  local_58.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  .super__Head_base<1UL,_phmap::priv::StatefulTestingHash,_false>._M_head_impl.
  super_WithId<phmap::priv::StatefulTestingHash>.id_ =
       (StatefulTestingHash)
       (StatefulTestingHash)
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId.
       super_WithId<phmap::priv::StatefulTestingHash>.id_;
  local_58.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0x70;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId.super_WithId<phmap::priv::StatefulTestingHash>.
  id_ = (WithId<phmap::priv::StatefulTestingHash>)
        (WithId<phmap::priv::StatefulTestingHash>)
        ((long)hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
               next_id<phmap::priv::StatefulTestingHash>()::gId.
               super_WithId<phmap::priv::StatefulTestingHash>.id_ + 1);
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId.super_WithId<phmap::priv::StatefulTestingEqual>.
  id_ = (WithId<phmap::priv::StatefulTestingEqual>)
        (WithId<phmap::priv::StatefulTestingEqual>)
        ((long)hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
               next_id<phmap::priv::StatefulTestingEqual>()::gId.
               super_WithId<phmap::priv::StatefulTestingEqual>.id_ + 1);
  raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ::initialize_slots(&local_58,0x7f);
  local_58.capacity_ = (size_t)&DAT_0000007f;
  local_98.id_ = (size_t)local_58.settings_.
                         super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
                         .
                         super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
                         .
                         super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
                         .
                         super__Tuple_impl<3UL,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
                         .
                         super__Head_base<3UL,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_false>
                         ._M_head_impl.id_;
  testing::internal::
  CmpHelperEQ<phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
            ((internal *)local_88,"m.get_allocator()","alloc",&local_98,&local_60);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x78,pcVar1);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((long *)local_98.id_ != (long *)0x0) {
      (**(code **)(*(long *)local_98.id_ + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_98.id_._0_1_ = local_58.size_ == 0;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58.size_ != 0) {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)&local_98,(AssertionResult *)"m.empty()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x79,(char *)CONCAT71(local_88._1_7_,local_88[0]));
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_a0.data_._4_4_,local_a0.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,local_a0.data_._0_4_) + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<>>>::
  operator()(local_88,(char *)&local_98,
             (flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
              *)0x2c2f35);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x7a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((long *)local_98.id_ != (long *)0x0) {
      (**(code **)(*(long *)local_98.id_ + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_98.id_ = local_58.capacity_;
  local_a0.data_._0_4_ = 0x7b;
  testing::internal::CmpHelperGE<unsigned_long,int>
            ((internal *)local_88,"m.bucket_count()","123",&local_98.id_,(int *)&local_a0);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x7b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((long *)local_98.id_ != (long *)0x0) {
      (**(code **)(*(long *)local_98.id_ + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ::destroy_slots(&local_58);
  return;
}

Assistant:

void BucketCountAllocTest(std::true_type) {
  using A = typename TypeParam::allocator_type;
  A alloc(0);
  TypeParam m(123, alloc);
  EXPECT_EQ(m.get_allocator(), alloc);
  EXPECT_TRUE(m.empty());
  EXPECT_THAT(m, ::testing::UnorderedElementsAre());
  EXPECT_GE(m.bucket_count(), 123);
}